

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O2

WavelengthUnit
FileParse::enumFromStringCaseInsensitive<BSDFData::WavelengthUnit,3ul>
          (string_view name,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *values,WavelengthUnit defaultValue)

{
  __type_conflict _Var1;
  long lVar2;
  string lowerName;
  string_view in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  toLower_abi_cxx11_(in_stack_ffffffffffffff88);
  lVar2 = 0;
  do {
    if (lVar2 == 3) {
LAB_00176ef2:
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
      return defaultValue;
    }
    toLower_abi_cxx11_(in_stack_ffffffffffffff88);
    _Var1 = std::operator==(&local_50,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &stack0xffffffffffffff90);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      defaultValue = (WavelengthUnit)lVar2;
      goto LAB_00176ef2;
    }
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

EnumType enumFromStringCaseInsensitive(std::string_view name,
                                           const std::array<std::string, N> & values,
                                           EnumType defaultValue)
    {
        std::string lowerName = toLower(name);
        for(std::size_t i = 0; i < values.size(); ++i)
        {
            if(toLower(values[i]) == lowerName)
            {
                return static_cast<EnumType>(i);
            }
        }

        return defaultValue;
    }